

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
legacy::_mapToNextInstr
          (LLVMDependenceGraph *param_1,
          set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *callsites
          )

{
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this;
  bool bVar1;
  reference ppLVar2;
  Instruction *pIVar3;
  LLVMNode *this_00;
  undefined8 in_RDX;
  Value *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::LLVMNode_*>,_bool> pVar4;
  LLVMNode *node;
  LLVMDependenceGraph *local_dg;
  Instruction *succ;
  Instruction *I;
  LLVMNode *cs;
  iterator __end1;
  iterator __begin1;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *__range1;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *nodes;
  Value *in_stack_ffffffffffffff78;
  Value *Str;
  _Rb_tree_const_iterator<dg::LLVMNode_*> in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  Str = in_RDI;
  local_18 = in_RDX;
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             0x1e1e80);
  local_28 = local_18;
  local_30._M_node =
       (_Base_ptr)
       std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::begin
                 ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )in_stack_ffffffffffffff78);
  local_38._M_node =
       (_Base_ptr)
       std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::end
                 ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      return (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)Str;
    }
    ppLVar2 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1e1eca);
    this = (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*ppLVar2;
    dg::LLVMNode::getValue((LLVMNode *)0x1e1edc);
    llvm::dyn_cast<llvm::Instruction,llvm::Value>(in_RDI);
    pIVar3 = llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getNextNode
                       ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)
                        in_stack_ffffffffffffff90._M_node);
    if (pIVar3 == (Instruction *)0x0) break;
    dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDG(this);
    this_00 = dg::DependenceGraph<dg::LLVMNode>::getNode
                        ((DependenceGraph<dg::LLVMNode> *)in_RDI,in_stack_ffffffffffffff78);
    pVar4 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
            insert((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)this_00,
                   (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffff90 = pVar4.first._M_node;
    in_stack_ffffffffffffff98 = pVar4.second;
    std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
              ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_RDI);
  }
  llvm::errs();
  llvm::operator<<((raw_ostream *)in_RDI,in_stack_ffffffffffffff78);
  llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff90._M_node,(char *)Str);
  abort();
}

Assistant:

static std::set<LLVMNode *>
_mapToNextInstr(LLVMDependenceGraph & /*unused*/,
                const std::set<LLVMNode *> &callsites) {
    std::set<LLVMNode *> nodes;

    for (LLVMNode *cs : callsites) {
        llvm::Instruction *I =
                llvm::dyn_cast<llvm::Instruction>(cs->getValue());
        assert(I && "Callsite is not an instruction");
        llvm::Instruction *succ = I->getNextNode();
        if (!succ) {
            llvm::errs() << *I << "has no successor that could be criterion\n";
            // abort for now
            abort();
        }

        LLVMDependenceGraph *local_dg = cs->getDG();
        LLVMNode *node = local_dg->getNode(succ);
        assert(node && "DG does not have such node");
        nodes.insert(node);
    }

    return nodes;
}